

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# B3DImporter.cpp
# Opt level: O0

void __thiscall Assimp::B3DImporter::Oops(B3DImporter *this)

{
  DeadlyImportError *this_00;
  allocator<char> local_31;
  string local_30;
  B3DImporter *local_10;
  B3DImporter *this_local;
  
  local_10 = this;
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"B3D Importer - INTERNAL ERROR",&local_31);
  DeadlyImportError::DeadlyImportError(this_00,&local_30);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

AI_WONT_RETURN void B3DImporter::Oops(){
    throw DeadlyImportError( "B3D Importer - INTERNAL ERROR" );
}